

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc_inl.h
# Opt level: O0

OPJ_UINT32 opj_mqc_raw_decode(opj_mqc_t *mqc)

{
  OPJ_UINT32 d;
  opj_mqc_t *mqc_local;
  
  if (mqc->ct == 0) {
    if (mqc->c == 0xff) {
      if (*mqc->bp < 0x90) {
        mqc->c = (uint)*mqc->bp;
        mqc->bp = mqc->bp + 1;
        mqc->ct = 7;
      }
      else {
        mqc->c = 0xff;
        mqc->ct = 8;
      }
    }
    else {
      mqc->c = (uint)*mqc->bp;
      mqc->bp = mqc->bp + 1;
      mqc->ct = 8;
    }
  }
  mqc->ct = mqc->ct - 1;
  return mqc->c >> ((byte)mqc->ct & 0x1f) & 1;
}

Assistant:

static INLINE OPJ_UINT32 opj_mqc_raw_decode(opj_mqc_t *mqc)
{
    OPJ_UINT32 d;
    if (mqc->ct == 0) {
        /* Given opj_mqc_raw_init_dec() we know that at some point we will */
        /* have a 0xFF 0xFF artificial marker */
        if (mqc->c == 0xff) {
            if (*mqc->bp  > 0x8f) {
                mqc->c = 0xff;
                mqc->ct = 8;
            } else {
                mqc->c = *mqc->bp;
                mqc->bp ++;
                mqc->ct = 7;
            }
        } else {
            mqc->c = *mqc->bp;
            mqc->bp ++;
            mqc->ct = 8;
        }
    }
    mqc->ct--;
    d = ((OPJ_UINT32)mqc->c >> mqc->ct) & 0x01U;

    return d;
}